

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBodyConcaveCollisionAlgorithm.cpp
# Opt level: O0

void __thiscall
btSoftBodyTriangleCallback::btSoftBodyTriangleCallback
          (btSoftBodyTriangleCallback *this,btDispatcher *dispatcher,
          btCollisionObjectWrapper *body0Wrap,btCollisionObjectWrapper *body1Wrap,bool isSwapped)

{
  btCollisionObjectWrapper *in_RCX;
  btCollisionObjectWrapper *in_RDX;
  _func_int **in_RSI;
  btTriangleCallback *in_RDI;
  byte in_R8B;
  btCollisionObject *local_70;
  btCollisionObject *local_58;
  btCollisionObject *in_stack_ffffffffffffffb0;
  
  btTriangleCallback::btTriangleCallback(in_RDI);
  in_RDI->_vptr_btTriangleCallback = (_func_int **)&PTR__btSoftBodyTriangleCallback_002e8820;
  btVector3::btVector3((btVector3 *)(in_RDI + 3));
  btVector3::btVector3((btVector3 *)(in_RDI + 5));
  in_RDI[8]._vptr_btTriangleCallback = in_RSI;
  in_RDI[9]._vptr_btTriangleCallback = (_func_int **)0x0;
  btHashMap<btHashKey<btTriIndex>,_btTriIndex>::btHashMap
            ((btHashMap<btHashKey<btTriIndex>,_btTriIndex> *)in_stack_ffffffffffffffb0);
  if ((in_R8B & 1) == 0) {
    local_58 = btCollisionObjectWrapper::getCollisionObject(in_RDX);
  }
  else {
    local_58 = btCollisionObjectWrapper::getCollisionObject(in_RCX);
    in_stack_ffffffffffffffb0 = local_58;
  }
  in_RDI[1]._vptr_btTriangleCallback = (_func_int **)local_58;
  if ((in_R8B & 1) == 0) {
    local_70 = btCollisionObjectWrapper::getCollisionObject(in_RCX);
  }
  else {
    local_70 = btCollisionObjectWrapper::getCollisionObject(in_RDX);
  }
  in_RDI[2]._vptr_btTriangleCallback = (_func_int **)local_70;
  clearCache((btSoftBodyTriangleCallback *)in_stack_ffffffffffffffb0);
  return;
}

Assistant:

btSoftBodyTriangleCallback::btSoftBodyTriangleCallback(btDispatcher*  dispatcher,const btCollisionObjectWrapper* body0Wrap,const btCollisionObjectWrapper* body1Wrap,bool isSwapped):
m_dispatcher(dispatcher),
m_dispatchInfoPtr(0)
{
	m_softBody = (isSwapped? (btSoftBody*)body1Wrap->getCollisionObject():(btSoftBody*)body0Wrap->getCollisionObject());
	m_triBody = isSwapped? body0Wrap->getCollisionObject():body1Wrap->getCollisionObject();

	//
	// create the manifold from the dispatcher 'manifold pool'
	//
	//	  m_manifoldPtr = m_dispatcher->getNewManifold(m_convexBody,m_triBody);

	clearCache();
}